

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O3

u_char * pcap_ether_aton(char *s)

{
  byte bVar1;
  ushort *puVar2;
  byte bVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  char cVar6;
  byte *pbVar7;
  
  pbVar4 = (byte *)malloc(6);
  if (pbVar4 == (byte *)0x0) {
    return (u_char *)0x0;
  }
  pbVar7 = pbVar4;
  do {
    bVar3 = *s;
    if ((bVar3 - 0x2d < 2) || (bVar3 == 0x3a)) {
      bVar3 = ((byte *)s)[1];
      s = (char *)((byte *)s + 1);
    }
    else if (bVar3 == 0) {
      return pbVar4;
    }
    ppuVar5 = __ctype_b_loc();
    puVar2 = *ppuVar5;
    cVar6 = ((puVar2[(char)bVar3] >> 9 & 1) == 0) * ' ' + -0x57;
    if ((puVar2[(char)bVar3] >> 0xb & 1) != 0) {
      cVar6 = -0x30;
    }
    bVar3 = bVar3 + cVar6;
    bVar1 = ((byte *)s)[1];
    if ((*(byte *)((long)puVar2 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) {
      s = (char *)((byte *)s + 1);
    }
    else {
      s = (char *)((byte *)s + 2);
      cVar6 = ((puVar2[(char)bVar1] >> 9 & 1) == 0) * ' ' + -0x57;
      if ((puVar2[(char)bVar1] >> 0xb & 1) != 0) {
        cVar6 = -0x30;
      }
      bVar3 = bVar1 + cVar6 | bVar3 * '\x10';
    }
    *pbVar7 = bVar3;
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

u_char *
pcap_ether_aton(const char *s)
{
	register u_char *ep, *e;
	register u_int d;

	e = ep = (u_char *)malloc(6);
	if (e == NULL)
		return (NULL);

	while (*s) {
		if (*s == ':' || *s == '.' || *s == '-')
			s += 1;
		d = xdtoi(*s++);
		if (isxdigit((unsigned char)*s)) {
			d <<= 4;
			d |= xdtoi(*s++);
		}
		*ep++ = d;
	}

	return (e);
}